

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O1

void __thiscall
efsw::FileWatcherInotify::handleAction
          (FileWatcherInotify *this,Watcher *watch,string *filename,unsigned_long action,
          string oldFilename)

{
  string *__lhs;
  WatchID WVar1;
  FileWatchListener *pFVar2;
  _Base_ptr p_Var3;
  size_type sVar4;
  pointer pcVar5;
  _Base_ptr __n;
  bool bVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Self __tmp;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Alloc_hider _Var11;
  _Self __tmp_1;
  _Rb_tree_header *p_Var12;
  string opath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  WatchID local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  long *local_1c0 [2];
  long local_1b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  long *local_180 [2];
  long local_170 [2];
  long *local_160 [2];
  long local_150 [2];
  string local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  string local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  FileInfo local_c0;
  FileInfo local_78;
  
  if (watch == (Watcher *)0x0) {
    return;
  }
  if (watch->Listener == (FileWatchListener *)0x0) {
    return;
  }
  __lhs = &watch->Directory;
  std::operator+(&local_210,__lhs,filename);
  if ((action & 10) == 0) {
    if ((char)action < '\0') {
      local_1e8 = &watch->OldFileName;
      sVar4 = (watch->OldFileName)._M_string_length;
      local_1f0 = watch->ID;
      pFVar2 = watch->Listener;
      if (sVar4 == 0) {
        local_160[0] = local_150;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"");
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,local_1f0,__lhs,filename,1,local_160);
        if (local_160[0] != local_150) {
          operator_delete(local_160[0],local_150[0] + 1);
        }
        WVar1 = watch->ID;
        pFVar2 = watch->Listener;
        local_180[0] = local_170;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"");
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,__lhs,filename,3,local_180);
        if (local_180[0] != local_170) {
          operator_delete(local_180[0],local_170[0] + 1);
        }
        paVar10 = &local_100.field_2;
        local_100._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_210._M_dataplus._M_p,
                   (long)(_Rb_tree_color *)local_210._M_string_length + local_210._M_dataplus._M_p);
        checkForNewWatcher(this,watch,&local_100);
        _Var11._M_p = local_100._M_dataplus._M_p;
      }
      else {
        paVar10 = &local_110;
        pcVar5 = (local_1e8->_M_dataplus)._M_p;
        local_120[0] = paVar10;
        std::__cxx11::string::_M_construct<char*>((string *)local_120,pcVar5,pcVar5 + sVar4);
        (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,local_1f0,__lhs,filename,4,local_120);
        _Var11._M_p = (pointer)local_120[0];
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var11._M_p != paVar10) {
        operator_delete(_Var11._M_p,paVar10->_M_allocated_capacity + 1);
      }
      if ((watch->Recursive == true) && (bVar6 = FileSystem::isDirectory(&local_210), bVar6)) {
        std::operator+(&local_1a0,__lhs,local_1e8);
        FileSystem::dirAddSlashAtEnd(&local_1a0);
        FileSystem::dirAddSlashAtEnd(&local_210);
        p_Var9 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var12 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var9 != p_Var12) {
          do {
            p_Var3 = p_Var9[1]._M_parent;
            __n = p_Var3->_M_right;
            if (__n == (_Base_ptr)local_1a0._M_string_length) {
              if (__n == (_Base_ptr)0x0) {
                bVar6 = true;
              }
              else {
                iVar7 = bcmp(p_Var3->_M_left,local_1a0._M_dataplus._M_p,(size_t)__n);
                bVar6 = iVar7 == 0;
              }
            }
            else {
              bVar6 = false;
            }
            if (bVar6) {
              p_Var3 = p_Var3[5]._M_parent;
              FileInfo::FileInfo(&local_78,&local_1a0);
              bVar6 = p_Var3 == (_Base_ptr)local_78.Inode;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
                operator_delete(local_78.Filepath._M_dataplus._M_p,
                                local_78.Filepath.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              bVar6 = false;
            }
            if (bVar6) {
              std::__cxx11::string::_M_assign((string *)&(p_Var9[1]._M_parent)->_M_left);
              FileInfo::FileInfo(&local_c0,&local_210);
              FileInfo::operator=((FileInfo *)&p_Var9[1]._M_parent[3]._M_parent,&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0.Filepath._M_dataplus._M_p != &local_c0.Filepath.field_2) {
                operator_delete(local_c0.Filepath._M_dataplus._M_p,
                                local_c0.Filepath.field_2._M_allocated_capacity + 1);
              }
              break;
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != p_Var12);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_1e8,0,(char *)(watch->OldFileName)._M_string_length,0x1202ad);
      goto LAB_0011a472;
    }
    if (((uint)action >> 8 & 1) == 0) {
      if ((action & 0x40) == 0) {
        if (((uint)action >> 9 & 1) != 0) {
          WVar1 = watch->ID;
          pFVar2 = watch->Listener;
          local_1e0[0] = local_1d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
          (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,__lhs,filename,2,local_1e0);
          if (local_1e0[0] != local_1d0) {
            operator_delete(local_1e0[0],local_1d0[0] + 1);
          }
          FileSystem::dirAddSlashAtEnd(&local_210);
          _Var11._M_p = local_210._M_dataplus._M_p;
          if (watch->Recursive == true) {
            for (p_Var8 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var8 != &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
                p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
              p_Var9 = p_Var8[1]._M_parent;
              p_Var3 = p_Var9->_M_right;
              if ((p_Var3 == (_Base_ptr)local_210._M_string_length) &&
                 ((p_Var3 == (_Base_ptr)0x0 ||
                  (iVar7 = bcmp(p_Var9->_M_left,_Var11._M_p,(size_t)p_Var3), iVar7 == 0)))) {
                (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[4])(this,p_Var9->_M_parent);
                break;
              }
            }
          }
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&watch->OldFileName);
      }
      goto LAB_0011a472;
    }
    WVar1 = watch->ID;
    pFVar2 = watch->Listener;
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"");
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,__lhs,filename,1,local_1c0);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    paVar10 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_210._M_dataplus._M_p,
               (long)(_Rb_tree_color *)local_210._M_string_length + local_210._M_dataplus._M_p);
    checkForNewWatcher(this,watch,&local_140);
    _Var11._M_p = local_140._M_dataplus._M_p;
  }
  else {
    WVar1 = watch->ID;
    pFVar2 = watch->Listener;
    paVar10 = &local_d0;
    local_e0[0] = paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"");
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,__lhs,filename,3,local_e0);
    _Var11._M_p = (pointer)local_e0[0];
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var11._M_p != paVar10) {
    operator_delete(_Var11._M_p,paVar10->_M_allocated_capacity + 1);
  }
LAB_0011a472:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FileWatcherInotify::handleAction( Watcher* watch, const std::string& filename, unsigned long action, std::string oldFilename )
{
	if ( !watch || !watch->Listener )
	{
		return;
	}

	std::string fpath( watch->Directory + filename );

	if ( ( IN_CLOSE_WRITE & action ) || ( IN_MODIFY & action ) )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Modified );
	}
	else if( IN_MOVED_TO & action )
	{
		/// If OldFileName doesn't exist means that the file has been moved from other folder, so we just send the Add event
		if ( watch->OldFileName.empty() )
		{
			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Add );

			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Modified );

			checkForNewWatcher( watch, fpath );
		}
		else
		{
			watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Moved, watch->OldFileName );
		}

		if ( watch->Recursive && FileSystem::isDirectory( fpath ) )
		{
			/// Update the new directory path
			std::string opath( watch->Directory + watch->OldFileName );
			FileSystem::dirAddSlashAtEnd( opath );
			FileSystem::dirAddSlashAtEnd( fpath );

			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); it++ )
			{
				if ( it->second->Directory == opath && it->second->DirInfo.Inode == FileInfo( opath ).Inode )
				{
					it->second->Directory	= fpath;
					it->second->DirInfo		= FileInfo( fpath );

					break;
				}
			}
		}

		watch->OldFileName = "";
	}
	else if( IN_CREATE & action )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Add );

		checkForNewWatcher( watch, fpath );
	}
	else if ( IN_MOVED_FROM & action )
	{
		watch->OldFileName = filename;
	}
	else if( IN_DELETE & action )
	{
		watch->Listener->handleFileAction( watch->ID, watch->Directory, filename, Actions::Delete );

		FileSystem::dirAddSlashAtEnd( fpath );

		/// If the file erased is a directory and recursive is enabled, removes the directory erased
		if ( watch->Recursive )
		{
			for ( WatchMap::iterator it = mWatches.begin(); it != mWatches.end(); it++ )
			{
				if ( it->second->Directory == fpath )
				{
					removeWatch( it->second->ID );
					break;
				}
			}
		}
	}
}